

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_stats.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  string_view filename_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  col_names;
  vector<long_double,_std::allocator<long_double>_> vars;
  vector<long_double,_std::allocator<long_double>_> means;
  vector<long_double,_std::allocator<long_double>_> max;
  vector<long_double,_std::allocator<long_double>_> min;
  string filename;
  CSVFormat local_218;
  CSVStat stats;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filename,argv[1],(allocator<char> *)&stats);
    csv::CSVFormat::guess_csv();
    filename_00._M_str = filename._M_dataplus._M_p;
    filename_00._M_len = filename._M_string_length;
    csv::CSVStat::CSVStat(&stats,filename_00,&local_218);
    csv::CSVFormat::~CSVFormat(&local_218);
    csv::CSVReader::get_col_names_abi_cxx11_(&col_names,&stats.reader);
    csv::CSVStat::get_mins(&min,&stats);
    csv::CSVStat::get_maxes(&max,&stats);
    csv::CSVStat::get_mean(&means,&stats);
    csv::CSVStat::get_variance(&vars,&stats);
    lVar3 = 0;
    lVar2 = 0;
    for (uVar4 = 0;
        uVar4 < (ulong)((long)col_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)col_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar4 = uVar4 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,
                               (string *)
                               ((long)&((col_names.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar3));
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"Min: ");
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           ((long)min.super__Vector_base<long_double,_std::allocator<long_double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar2));
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"Max: ");
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           ((long)max.super__Vector_base<long_double,_std::allocator<long_double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar2));
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"Mean: ");
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           ((long)means.
                                  super__Vector_base<long_double,_std::allocator<long_double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar2));
      poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
      std::operator<<(poVar1,"Var: ");
      poVar1 = std::ostream::_M_insert<long_double>
                         (*(longdouble *)
                           ((long)vars.super__Vector_base<long_double,_std::allocator<long_double>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar2));
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar2 = lVar2 + 0x10;
      lVar3 = lVar3 + 0x20;
    }
    std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
              (&vars.super__Vector_base<long_double,_std::allocator<long_double>_>);
    std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
              (&means.super__Vector_base<long_double,_std::allocator<long_double>_>);
    std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
              (&max.super__Vector_base<long_double,_std::allocator<long_double>_>);
    std::_Vector_base<long_double,_std::allocator<long_double>_>::~_Vector_base
              (&min.super__Vector_base<long_double,_std::allocator<long_double>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&col_names);
    csv::CSVStat::~CSVStat(&stats);
    std::__cxx11::string::~string((string *)&filename);
    return 0;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,*argv);
  poVar1 = std::operator<<(poVar1," [file]");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

int main(int argc, char** argv) {
    using namespace csv;

    if (argc < 2) {
        std::cout << "Usage: " << argv[0] << " [file]" << std::endl;
        exit(1);
    }

    std::string filename = argv[1];
    CSVStat stats(filename);

    auto col_names = stats.get_col_names();
    auto min = stats.get_mins(), max = stats.get_maxes(),
        means = stats.get_mean(), vars = stats.get_variance();

    for (size_t i = 0; i < col_names.size(); i++) {
        std::cout << col_names[i] << std::endl
            << "Min: " << min[i] << std::endl
            << "Max: " << max[i] << std::endl
            << "Mean: " << means[i] << std::endl
            << "Var: " << vars[i] << std::endl;
    }

    return 0;
}